

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpcollisionlist.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPCollisionList::HasAddress(RTPCollisionList *this,RTPAddress *addr)

{
  bool bVar1;
  uint uVar2;
  reference pAVar3;
  _Self local_38;
  _List_node_base *local_30;
  _List_const_iterator<jrtplib::RTPCollisionList::AddressAndTime> local_28;
  const_iterator it;
  RTPAddress *addr_local;
  RTPCollisionList *this_local;
  
  it._M_node = (_List_node_base *)addr;
  std::_List_const_iterator<jrtplib::RTPCollisionList::AddressAndTime>::_List_const_iterator
            (&local_28);
  local_30 = (_List_node_base *)
             std::__cxx11::
             list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
             ::begin(&this->addresslist);
  local_28._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
         ::end(&this->addresslist);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) {
      return false;
    }
    pAVar3 = std::_List_const_iterator<jrtplib::RTPCollisionList::AddressAndTime>::operator*
                       (&local_28);
    uVar2 = (*pAVar3->addr->_vptr_RTPAddress[1])();
    if ((uVar2 & 1) != 0) break;
    std::_List_const_iterator<jrtplib::RTPCollisionList::AddressAndTime>::operator++(&local_28,0);
  }
  return true;
}

Assistant:

bool RTPCollisionList::HasAddress(const RTPAddress *addr) const
{
	std::list<AddressAndTime>::const_iterator it;
	
	for (it = addresslist.begin() ; it != addresslist.end() ; it++)
	{
		if (((*it).addr)->IsSameAddress(addr))
			return true;
	}

	return false;	
}